

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O1

void __thiscall QXcbScreen::~QXcbScreen(QXcbScreen *this)

{
  int *piVar1;
  
  *(undefined ***)this = &PTR__QXcbScreen_001b5f78;
  *(undefined ***)(this + 0x18) = &PTR__QXcbScreen_001b6078;
  QArrayDataPointer<QList<unsigned_short>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<unsigned_short>_> *)(this + 0x1a0));
  piVar1 = *(int **)(this + 0x130);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x130),2,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x118);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x118),2,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x100);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x100),2,0x10);
    }
  }
  piVar1 = *(int **)(this + 0xe8);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0xe8),2,0x10);
    }
  }
  if (*(long **)(this + 0xd8) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0xd8) + 0x20))();
  }
  *(undefined8 *)(this + 0xd8) = 0;
  QColorSpace::~QColorSpace((QColorSpace *)(this + 200));
  piVar1 = *(int **)(this + 0x70);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x70),2,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x58);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x58),4,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x40);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x40),4,0x10);
    }
  }
  QNativeInterface::Private::QXcbScreen::~QXcbScreen(this + 0x18);
  QPlatformScreen::~QPlatformScreen((QPlatformScreen *)this);
  return;
}

Assistant:

QXcbScreen::~QXcbScreen()
{
}